

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_info.cpp
# Opt level: O3

ostream * CMU462::Collada::operator<<(ostream *os,LightInfo *light)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"LightInfo: ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(light->super_Instance).name._M_dataplus._M_p,
                      (light->super_Instance).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (id:",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(light->super_Instance).id._M_dataplus._M_p,
                      (light->super_Instance).id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(os," [",2);
  switch(light->light_type) {
  case NONE:
    std::__ostream_insert<char,std::char_traits<char>>(os,"type=none",9);
  case AMBIENT:
    std::__ostream_insert<char,std::char_traits<char>>(os," type=ambient",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(os," spectrum=",10);
    CMU462::operator<<(os,&light->spectrum);
    goto switchD_0016c396_default;
  case DIRECTIONAL:
    pcVar3 = " type=directional";
    lVar2 = 0x11;
    break;
  case AREA:
    pcVar3 = " type=area";
    lVar2 = 10;
    break;
  case POINT:
    std::__ostream_insert<char,std::char_traits<char>>(os," type=point",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(os," spectrum=",10);
    poVar1 = CMU462::operator<<(os,&light->spectrum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," position=",10);
    poVar1 = CMU462::operator<<(poVar1,&light->position);
    goto LAB_0016c57e;
  case SPOT:
    std::__ostream_insert<char,std::char_traits<char>>(os," type=spot",10);
    std::__ostream_insert<char,std::char_traits<char>>(os," spectrum=",10);
    poVar1 = CMU462::operator<<(os,&light->spectrum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," position=",10);
    poVar1 = CMU462::operator<<(poVar1,&light->position);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," direction=",0xb);
    poVar1 = CMU462::operator<<(poVar1,&light->direction);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," falloff_deg=",0xd);
    poVar1 = std::ostream::_M_insert<double>((double)light->falloff_deg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," falloff_exp=",0xd);
    poVar1 = std::ostream::_M_insert<double>((double)light->falloff_exp);
LAB_0016c57e:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," constant_att=",0xe);
    poVar1 = std::ostream::_M_insert<double>((double)light->constant_att);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," linear_att=",0xc);
    poVar1 = std::ostream::_M_insert<double>((double)light->linear_att);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," quadratic_att=",0xf);
    std::ostream::_M_insert<double>((double)light->quadratic_att);
  default:
    goto switchD_0016c396_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(os," spectrum=",10);
  poVar1 = CMU462::operator<<(os,&light->spectrum);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," direction=",0xb);
  CMU462::operator<<(poVar1,&light->direction);
switchD_0016c396_default:
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LightInfo& light) {

  os << "LightInfo: " << light.name << " (id:" << light.id << ")";

  os << " [";

    switch (light.light_type) {
      case LightType::NONE:
        os << "type=none";
      case LightType::AMBIENT:
        os << " type=ambient"
           << " spectrum=" << light.spectrum;
        break;
      case LightType::DIRECTIONAL:
        os << " type=directional"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::AREA:
        os << " type=area"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::POINT:
        os << " type=point"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
      case LightType::SPOT:
        os << " type=spot"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " direction=" << light.direction
           << " falloff_deg=" << light.falloff_deg
           << " falloff_exp=" << light.falloff_exp
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
    }

  os << " ]";

  return os;
}